

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 (*pauVar19) [16];
  undefined1 (*pauVar20) [16];
  long lVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong unaff_R14;
  ulong uVar31;
  ulong uVar32;
  InstancePrimitive *prim;
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24e1;
  ulong local_24e0;
  ulong local_24d8;
  ulong local_24d0;
  ulong local_24c8;
  ulong local_24c0;
  ulong local_24b8;
  undefined1 (*local_24b0) [16];
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_24b0 = (undefined1 (*) [16])local_2390;
      auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar36 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar40 = vandps_avx((undefined1  [16])aVar1,auVar40);
      auVar42._8_4_ = 0x219392ef;
      auVar42._0_8_ = 0x219392ef219392ef;
      auVar42._12_4_ = 0x219392ef;
      auVar40 = vcmpps_avx(auVar40,auVar42,1);
      auVar40 = vblendvps_avx((undefined1  [16])aVar1,auVar42,auVar40);
      auVar42 = vrcpps_avx(auVar40);
      fVar5 = auVar42._0_4_;
      auVar37._0_4_ = auVar40._0_4_ * fVar5;
      fVar6 = auVar42._4_4_;
      auVar37._4_4_ = auVar40._4_4_ * fVar6;
      fVar7 = auVar42._8_4_;
      auVar37._8_4_ = auVar40._8_4_ * fVar7;
      fVar8 = auVar42._12_4_;
      auVar37._12_4_ = auVar40._12_4_ * fVar8;
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = &DAT_3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar43,auVar37);
      uVar30 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar30;
      local_23c0._0_4_ = uVar30;
      local_23c0._8_4_ = uVar30;
      local_23c0._12_4_ = uVar30;
      local_23c0._16_4_ = uVar30;
      local_23c0._20_4_ = uVar30;
      local_23c0._24_4_ = uVar30;
      local_23c0._28_4_ = uVar30;
      auVar45 = ZEXT3264(local_23c0);
      uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar30;
      local_23e0._0_4_ = uVar30;
      local_23e0._8_4_ = uVar30;
      local_23e0._12_4_ = uVar30;
      local_23e0._16_4_ = uVar30;
      local_23e0._20_4_ = uVar30;
      local_23e0._24_4_ = uVar30;
      local_23e0._28_4_ = uVar30;
      auVar47 = ZEXT3264(local_23e0);
      auVar38._0_4_ = fVar5 + fVar5 * auVar40._0_4_;
      auVar38._4_4_ = fVar6 + fVar6 * auVar40._4_4_;
      auVar38._8_4_ = fVar7 + fVar7 * auVar40._8_4_;
      auVar38._12_4_ = fVar8 + fVar8 * auVar40._12_4_;
      uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar30;
      local_2400._0_4_ = uVar30;
      local_2400._8_4_ = uVar30;
      local_2400._12_4_ = uVar30;
      local_2400._16_4_ = uVar30;
      local_2400._20_4_ = uVar30;
      local_2400._24_4_ = uVar30;
      local_2400._28_4_ = uVar30;
      auVar49 = ZEXT3264(local_2400);
      auVar40 = vshufps_avx(auVar38,auVar38,0);
      local_2420._16_16_ = auVar40;
      local_2420._0_16_ = auVar40;
      auVar50 = ZEXT3264(local_2420);
      auVar40 = vmovshdup_avx(auVar38);
      auVar42 = vshufps_avx(auVar38,auVar38,0x55);
      local_2440._16_16_ = auVar42;
      local_2440._0_16_ = auVar42;
      auVar51 = ZEXT3264(local_2440);
      auVar42 = vshufpd_avx(auVar38,auVar38,1);
      auVar37 = vshufps_avx(auVar38,auVar38,0xaa);
      local_24c0 = (ulong)(auVar38._0_4_ < 0.0) << 5;
      local_24c8 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x40;
      local_2460._16_16_ = auVar37;
      local_2460._0_16_ = auVar37;
      auVar52 = ZEXT3264(local_2460);
      local_24d0 = (ulong)(auVar42._0_4_ < 0.0) << 5 | 0x80;
      local_24d8 = local_24c0 ^ 0x20;
      local_24e0 = local_24c8 ^ 0x20;
      local_24a8 = local_24d0 ^ 0x20;
      auVar40 = vshufps_avx(auVar34,auVar34,0);
      local_2480._16_16_ = auVar40;
      local_2480._0_16_ = auVar40;
      auVar53 = ZEXT3264(local_2480);
      auVar40 = vshufps_avx(auVar36,auVar36,0);
      auVar33 = ZEXT3264(CONCAT1616(auVar40,auVar40));
      uVar24 = local_24d0;
      uVar25 = local_24d8;
      uVar26 = local_24e0;
      uVar27 = local_24c0;
      uVar29 = local_24c8;
      do {
        do {
          if (local_24b0 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar19 = local_24b0 + -1;
          local_24b0 = local_24b0 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar19 + 8));
        uVar32 = *(ulong *)*local_24b0;
        do {
          auVar48 = auVar49._0_32_;
          auVar46 = auVar47._0_32_;
          auVar44 = auVar45._0_32_;
          if ((uVar32 & 8) == 0) {
            auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar27),auVar44);
            auVar10._4_4_ = auVar50._4_4_ * auVar9._4_4_;
            auVar10._0_4_ = auVar50._0_4_ * auVar9._0_4_;
            auVar10._8_4_ = auVar50._8_4_ * auVar9._8_4_;
            auVar10._12_4_ = auVar50._12_4_ * auVar9._12_4_;
            auVar10._16_4_ = auVar50._16_4_ * auVar9._16_4_;
            auVar10._20_4_ = auVar50._20_4_ * auVar9._20_4_;
            auVar10._24_4_ = auVar50._24_4_ * auVar9._24_4_;
            auVar10._28_4_ = auVar9._28_4_;
            auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar29),auVar46);
            auVar11._4_4_ = auVar51._4_4_ * auVar9._4_4_;
            auVar11._0_4_ = auVar51._0_4_ * auVar9._0_4_;
            auVar11._8_4_ = auVar51._8_4_ * auVar9._8_4_;
            auVar11._12_4_ = auVar51._12_4_ * auVar9._12_4_;
            auVar11._16_4_ = auVar51._16_4_ * auVar9._16_4_;
            auVar11._20_4_ = auVar51._20_4_ * auVar9._20_4_;
            auVar11._24_4_ = auVar51._24_4_ * auVar9._24_4_;
            auVar11._28_4_ = auVar9._28_4_;
            auVar9 = vmaxps_avx(auVar10,auVar11);
            auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar24),auVar48);
            auVar12._4_4_ = auVar52._4_4_ * auVar10._4_4_;
            auVar12._0_4_ = auVar52._0_4_ * auVar10._0_4_;
            auVar12._8_4_ = auVar52._8_4_ * auVar10._8_4_;
            auVar12._12_4_ = auVar52._12_4_ * auVar10._12_4_;
            auVar12._16_4_ = auVar52._16_4_ * auVar10._16_4_;
            auVar12._20_4_ = auVar52._20_4_ * auVar10._20_4_;
            auVar12._24_4_ = auVar52._24_4_ * auVar10._24_4_;
            auVar12._28_4_ = auVar10._28_4_;
            auVar10 = vmaxps_avx(auVar12,auVar53._0_32_);
            local_24a0 = vmaxps_avx(auVar9,auVar10);
            auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar25),auVar44);
            auVar13._4_4_ = auVar50._4_4_ * auVar9._4_4_;
            auVar13._0_4_ = auVar50._0_4_ * auVar9._0_4_;
            auVar13._8_4_ = auVar50._8_4_ * auVar9._8_4_;
            auVar13._12_4_ = auVar50._12_4_ * auVar9._12_4_;
            auVar13._16_4_ = auVar50._16_4_ * auVar9._16_4_;
            auVar13._20_4_ = auVar50._20_4_ * auVar9._20_4_;
            auVar13._24_4_ = auVar50._24_4_ * auVar9._24_4_;
            auVar13._28_4_ = auVar9._28_4_;
            auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar26),auVar46);
            auVar14._4_4_ = auVar51._4_4_ * auVar9._4_4_;
            auVar14._0_4_ = auVar51._0_4_ * auVar9._0_4_;
            auVar14._8_4_ = auVar51._8_4_ * auVar9._8_4_;
            auVar14._12_4_ = auVar51._12_4_ * auVar9._12_4_;
            auVar14._16_4_ = auVar51._16_4_ * auVar9._16_4_;
            auVar14._20_4_ = auVar51._20_4_ * auVar9._20_4_;
            auVar14._24_4_ = auVar51._24_4_ * auVar9._24_4_;
            auVar14._28_4_ = auVar9._28_4_;
            auVar9 = vminps_avx(auVar13,auVar14);
            auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + local_24a8),auVar48);
            auVar15._4_4_ = auVar52._4_4_ * auVar10._4_4_;
            auVar15._0_4_ = auVar52._0_4_ * auVar10._0_4_;
            auVar15._8_4_ = auVar52._8_4_ * auVar10._8_4_;
            auVar15._12_4_ = auVar52._12_4_ * auVar10._12_4_;
            auVar15._16_4_ = auVar52._16_4_ * auVar10._16_4_;
            auVar15._20_4_ = auVar52._20_4_ * auVar10._20_4_;
            auVar15._24_4_ = auVar52._24_4_ * auVar10._24_4_;
            auVar15._28_4_ = auVar10._28_4_;
            auVar10 = vminps_avx(auVar15,auVar33._0_32_);
            auVar9 = vminps_avx(auVar9,auVar10);
            auVar9 = vcmpps_avx(local_24a0,auVar9,2);
            uVar30 = vmovmskps_avx(auVar9);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar30);
          }
          if ((uVar32 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar18 = 4;
            }
            else {
              uVar31 = uVar32 & 0xfffffffffffffff0;
              lVar28 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                }
              }
              iVar18 = 0;
              uVar32 = *(ulong *)(uVar31 + lVar28 * 8);
              uVar23 = unaff_R14 - 1 & unaff_R14;
              if (uVar23 != 0) {
                uVar2 = *(uint *)(local_24a0 + lVar28 * 4);
                lVar28 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar31 + lVar28 * 8);
                uVar3 = *(uint *)(local_24a0 + lVar28 * 4);
                uVar23 = uVar23 - 1 & uVar23;
                uVar24 = local_24d0;
                uVar25 = local_24d8;
                uVar26 = local_24e0;
                if (uVar23 == 0) {
                  if (uVar2 < uVar3) {
                    *(ulong *)*local_24b0 = uVar4;
                    *(uint *)(*local_24b0 + 8) = uVar3;
                    local_24b0 = local_24b0 + 1;
                  }
                  else {
                    *(ulong *)*local_24b0 = uVar32;
                    *(uint *)(*local_24b0 + 8) = uVar2;
                    local_24b0 = local_24b0 + 1;
                    uVar32 = uVar4;
                  }
                }
                else {
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = uVar32;
                  auVar40 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar2));
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = uVar4;
                  auVar34 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
                  lVar28 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                    }
                  }
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = *(ulong *)(uVar31 + lVar28 * 8);
                  auVar36 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_24a0 + lVar28 * 4)));
                  uVar23 = uVar23 - 1 & uVar23;
                  if (uVar23 == 0) {
                    auVar42 = vpcmpgtd_avx(auVar34,auVar40);
                    auVar37 = vpshufd_avx(auVar42,0xaa);
                    auVar42 = vblendvps_avx(auVar34,auVar40,auVar37);
                    auVar40 = vblendvps_avx(auVar40,auVar34,auVar37);
                    auVar34 = vpcmpgtd_avx(auVar36,auVar42);
                    auVar37 = vpshufd_avx(auVar34,0xaa);
                    auVar34 = vblendvps_avx(auVar36,auVar42,auVar37);
                    auVar36 = vblendvps_avx(auVar42,auVar36,auVar37);
                    auVar42 = vpcmpgtd_avx(auVar36,auVar40);
                    auVar37 = vpshufd_avx(auVar42,0xaa);
                    auVar42 = vblendvps_avx(auVar36,auVar40,auVar37);
                    auVar40 = vblendvps_avx(auVar40,auVar36,auVar37);
                    *local_24b0 = auVar40;
                    local_24b0[1] = auVar42;
                    uVar32 = auVar34._0_8_;
                    local_24b0 = local_24b0 + 2;
                  }
                  else {
                    lVar28 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                      }
                    }
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = *(ulong *)(uVar31 + lVar28 * 8);
                    auVar42 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_24a0 + lVar28 * 4)));
                    uVar23 = uVar23 - 1 & uVar23;
                    if (uVar23 == 0) {
                      auVar37 = vpcmpgtd_avx(auVar34,auVar40);
                      auVar38 = vpshufd_avx(auVar37,0xaa);
                      auVar37 = vblendvps_avx(auVar34,auVar40,auVar38);
                      auVar40 = vblendvps_avx(auVar40,auVar34,auVar38);
                      auVar34 = vpcmpgtd_avx(auVar42,auVar36);
                      auVar38 = vpshufd_avx(auVar34,0xaa);
                      auVar34 = vblendvps_avx(auVar42,auVar36,auVar38);
                      auVar36 = vblendvps_avx(auVar36,auVar42,auVar38);
                      auVar42 = vpcmpgtd_avx(auVar36,auVar40);
                      auVar38 = vpshufd_avx(auVar42,0xaa);
                      auVar42 = vblendvps_avx(auVar36,auVar40,auVar38);
                      auVar40 = vblendvps_avx(auVar40,auVar36,auVar38);
                      auVar36 = vpcmpgtd_avx(auVar34,auVar37);
                      auVar38 = vpshufd_avx(auVar36,0xaa);
                      auVar36 = vblendvps_avx(auVar34,auVar37,auVar38);
                      auVar34 = vblendvps_avx(auVar37,auVar34,auVar38);
                      auVar37 = vpcmpgtd_avx(auVar42,auVar34);
                      auVar38 = vpshufd_avx(auVar37,0xaa);
                      auVar37 = vblendvps_avx(auVar42,auVar34,auVar38);
                      auVar34 = vblendvps_avx(auVar34,auVar42,auVar38);
                      *local_24b0 = auVar40;
                      local_24b0[1] = auVar34;
                      local_24b0[2] = auVar37;
                      uVar32 = auVar36._0_8_;
                      pauVar19 = local_24b0 + 3;
                    }
                    else {
                      *local_24b0 = auVar40;
                      local_24b0[1] = auVar34;
                      local_24b0[2] = auVar36;
                      local_24b0[3] = auVar42;
                      lVar28 = 0x30;
                      do {
                        lVar21 = lVar28;
                        lVar28 = 0;
                        if (uVar23 != 0) {
                          for (; (uVar23 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                          }
                        }
                        auVar35._8_8_ = 0;
                        auVar35._0_8_ = *(ulong *)(uVar31 + lVar28 * 8);
                        auVar40 = vpunpcklqdq_avx(auVar35,ZEXT416(*(uint *)(local_24a0 + lVar28 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(local_24b0[1] + lVar21) = auVar40;
                        uVar23 = uVar23 & uVar23 - 1;
                        lVar28 = lVar21 + 0x10;
                      } while (uVar23 != 0);
                      pauVar19 = (undefined1 (*) [16])(local_24b0[1] + lVar21);
                      if (lVar21 + 0x10 != 0) {
                        lVar28 = 0x10;
                        pauVar20 = local_24b0;
                        do {
                          uVar16 = *(undefined8 *)pauVar20[1];
                          uVar17 = *(undefined8 *)(pauVar20[1] + 8);
                          uVar2 = *(uint *)(pauVar20[1] + 8);
                          pauVar20 = pauVar20 + 1;
                          lVar21 = lVar28;
                          do {
                            if (uVar2 <= *(uint *)(local_24b0[-1] + lVar21 + 8)) {
                              pauVar22 = (undefined1 (*) [16])(*local_24b0 + lVar21);
                              break;
                            }
                            *(undefined1 (*) [16])(*local_24b0 + lVar21) =
                                 *(undefined1 (*) [16])(local_24b0[-1] + lVar21);
                            lVar21 = lVar21 + -0x10;
                            pauVar22 = local_24b0;
                          } while (lVar21 != 0);
                          *(undefined8 *)*pauVar22 = uVar16;
                          *(undefined8 *)(*pauVar22 + 8) = uVar17;
                          lVar28 = lVar28 + 0x10;
                        } while (pauVar19 != pauVar20);
                      }
                      uVar32 = *(ulong *)*pauVar19;
                    }
                    auVar45 = ZEXT3264(auVar44);
                    auVar47 = ZEXT3264(auVar46);
                    auVar49 = ZEXT3264(auVar48);
                    auVar50 = ZEXT3264(auVar50._0_32_);
                    auVar51 = ZEXT3264(auVar51._0_32_);
                    auVar52 = ZEXT3264(auVar52._0_32_);
                    auVar53 = ZEXT3264(auVar53._0_32_);
                    local_24b0 = pauVar19;
                    iVar18 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar18 = 6;
          }
        } while (iVar18 == 0);
        if (iVar18 == 6) {
          lVar28 = (ulong)((uint)uVar32 & 0xf) - 8;
          local_24b8 = unaff_R14;
          if (lVar28 != 0) {
            prim = (InstancePrimitive *)(uVar32 & 0xfffffffffffffff0);
            do {
              InstanceIntersector1::intersect(&local_24e1,ray,context,prim);
              prim = prim + 1;
              lVar28 = lVar28 + -1;
            } while (lVar28 != 0);
          }
          fVar5 = (ray->super_RayK<1>).tfar;
          auVar33 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,
                                                  CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(fVar5,
                                                  fVar5))))))));
          auVar45 = ZEXT3264(local_23c0);
          auVar47 = ZEXT3264(local_23e0);
          auVar49 = ZEXT3264(local_2400);
          auVar50 = ZEXT3264(local_2420);
          auVar51 = ZEXT3264(local_2440);
          auVar52 = ZEXT3264(local_2460);
          auVar53 = ZEXT3264(local_2480);
          uVar24 = local_24d0;
          uVar25 = local_24d8;
          uVar26 = local_24e0;
          uVar27 = local_24c0;
          uVar29 = local_24c8;
          unaff_R14 = local_24b8;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }